

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall
KktCheck::setIndexVectors
          (KktCheck *this,vector<int,_std::allocator<int>_> *rIndex,
          vector<int,_std::allocator<int>_> *cIndex)

{
  iterator iVar1;
  undefined8 in_RAX;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  undefined8 local_38;
  
  piVar2 = (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_38 = in_RAX;
  if (piVar3 != piVar2) {
    uVar4 = 0;
    do {
      if (piVar2[uVar4] != -1) {
        local_38 = CONCAT44((int)uVar4,(int)local_38);
        iVar1._M_current =
             (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->rIndexRev,iVar1,(int *)((long)&local_38 + 4));
          piVar2 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar1._M_current = (int)uVar4;
          (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        piVar3 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)piVar3 - (long)piVar2 >> 2));
  }
  piVar2 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 != piVar2) {
    uVar4 = 0;
    do {
      if (piVar2[uVar4] != -1) {
        local_38 = CONCAT44(local_38._4_4_,(int)uVar4);
        iVar1._M_current =
             (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->cIndexRev,iVar1,(int *)&local_38);
          piVar2 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar1._M_current = (int)uVar4;
          (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        piVar3 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)piVar3 - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void KktCheck::setIndexVectors(vector<int>& rIndex, vector<int>& cIndex){
	rIndexRev.clear();
	cIndexRev.clear();

	for (size_t i=0;i<rIndex.size(); i++) {
		if (rIndex[i] != -1) {
			rIndexRev.push_back(i);
		}
	}
	for (size_t i=0;i<cIndex.size(); i++) {
		if (cIndex[i] != -1) {
			cIndexRev.push_back(i);
		}
	}

}